

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
::emplace_new_key<std::basic_string_view<char,std::char_traits<char>>>
          (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string_view<char,_std::char_traits<char>_> *key)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_3
  *paVar9;
  sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
  *psVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar13;
  value_type to_insert;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  char *pcStack_20;
  undefined7 uVar8;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
       )distance_from_desired)) {
    lVar6 = *(long *)(this + 0x18) + 1;
    auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = 0x45300000;
    lVar4 = *(long *)(this + 8) + 1;
    auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = 0x45300000;
    if ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) {
      cVar1 = current_entry->distance_from_desired;
      uVar8 = (undefined7)((ulong)lVar6 >> 8);
      uVar7 = CONCAT71(uVar8,cVar1);
      if (cVar1 < '\0') {
        pcVar3 = key->_M_str;
        (current_entry->field_1).value._M_len = key->_M_len;
        (current_entry->field_1).value._M_str = pcVar3;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar2 = key->_M_len;
        pcVar3 = key->_M_str;
        current_entry->distance_from_desired = distance_from_desired;
        local_38._M_len = (current_entry->field_1).value._M_len;
        local_38._M_str = (current_entry->field_1).value._M_str;
        (current_entry->field_1).value._M_len = sVar2;
        (current_entry->field_1).value._M_str = pcVar3;
        uVar7 = CONCAT71(uVar8,cVar1 + '\x01');
        paVar9 = &current_entry[1].field_1;
        psVar10 = this;
        while( true ) {
          cVar1 = ((sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  ((long)paVar9 + -8))->distance_from_desired;
          uVar8 = (undefined7)((ulong)psVar10 >> 8);
          psVar10 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                     *)CONCAT71(uVar8,cVar1);
          cVar5 = (char)uVar7;
          if (cVar1 < '\0') break;
          if (cVar1 < cVar5) {
            ((sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
            ((long)paVar9 + -8))->distance_from_desired = cVar5;
            sVar2 = (paVar9->value)._M_len;
            pcVar3 = (paVar9->value)._M_str;
            (paVar9->value)._M_len = local_38._M_len;
            (paVar9->value)._M_str = local_38._M_str;
            psVar10 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                       *)CONCAT71(uVar8,cVar1 + '\x01');
            uVar7 = (ulong)psVar10 & 0xffffffff;
            local_38._M_len = sVar2;
            local_38._M_str = pcVar3;
          }
          else {
            uVar7 = CONCAT71((int7)(uVar7 >> 8),cVar5 + '\x01');
            if ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                 )(cVar5 + '\x01') == this[0x11]) {
              local_28 = local_38._M_len;
              pcStack_20 = local_38._M_str;
              sVar2 = (current_entry->field_1).value._M_len;
              pcVar3 = (current_entry->field_1).value._M_str;
              (current_entry->field_1).value._M_len = local_38._M_len;
              (current_entry->field_1).value._M_str = local_38._M_str;
              key = &local_38;
              local_38._M_len = sVar2;
              local_38._M_str = pcVar3;
              goto LAB_00166190;
            }
          }
          paVar9 = (anon_union_16_1_a8c68091_for_sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_3
                    *)((long)paVar9 + 0x18);
        }
        (paVar9->value)._M_len = local_38._M_len;
        (paVar9->value)._M_str = local_38._M_str;
        ((sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
        ((long)paVar9 + -8))->distance_from_desired = cVar5;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      pVar13._9_7_ = (int7)(uVar7 >> 8);
      pVar13.second = true;
      pVar13.first.current = current_entry;
      return pVar13;
    }
  }
LAB_00166190:
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::grow((sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *)this);
  pVar13 = emplace<std::basic_string_view<char,std::char_traits<char>>>(this,key);
  return pVar13;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }